

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O3

void libExtensions(char ***extensions,uint **extensionLengths,uint *extensionCount)

{
  uchar uVar1;
  char **ppcVar2;
  uint *targetLength;
  
  uVar1 = checkStringVectorOutParameter(extensions,extensionLengths,extensionCount);
  if (uVar1 != '\0') {
    *extensionCount = 1;
    ppcVar2 = (char **)malloc(8);
    *extensions = ppcVar2;
    targetLength = (uint *)malloc(4);
    *extensionLengths = targetLength;
    copyToStringOutParameter("so",2,*extensions,targetLength);
    return;
  }
  return;
}

Assistant:

void libExtensions(char *** extensions, unsigned int ** extensionLengths, unsigned int * extensionCount)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringVectorOutParameter(extensions, extensionLengths, extensionCount))
    {
        return;
    }

#if defined SYSTEM_WINDOWS
    *extensionCount = 1;
    *extensions = (char **)malloc(sizeof(char *) * *extensionCount);
    *extensionLengths = (unsigned int *)malloc(sizeof(unsigned int) * *extensionCount);
    copyToStringOutParameter("dll", 3, *extensions + 0, *extensionLengths + 0);
#elif defined SYSTEM_DARWIN
    *extensionCount = 2;
    *extensions = (char **)malloc(sizeof(char *) * *extensionCount);
    *extensionLengths = (unsigned int *)malloc(sizeof(unsigned int) * *extensionCount);
    copyToStringOutParameter("dylib", 5, *extensions + 0, *extensionLengths + 0);
    copyToStringOutParameter("so", 2, *extensions + 1, *extensionLengths + 1);
#else
    *extensionCount = 1;
    *extensions = (char **)malloc(sizeof(char *) * *extensionCount);
    *extensionLengths = (unsigned int *)malloc(sizeof(unsigned int) * *extensionCount);
    copyToStringOutParameter("so", 2, *extensions + 0, *extensionLengths + 0);
#endif
}